

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O2

bool __thiscall duckdb::DataTable::HasUniqueIndexes(DataTable *this)

{
  pointer puVar1;
  bool bVar2;
  int iVar3;
  DataTableInfo *pDVar4;
  type pIVar5;
  pointer this_00;
  bool bVar6;
  
  bVar2 = HasIndexes(this);
  if (bVar2) {
    pDVar4 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&this->info);
    ::std::mutex::lock(&(pDVar4->indexes).indexes_lock);
    this_00 = (pDVar4->indexes).indexes.
              super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (pDVar4->indexes).indexes.
             super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      bVar6 = this_00 == puVar1;
      bVar2 = !bVar6;
      if (bVar6) break;
      pIVar5 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator*
                         (this_00);
      iVar3 = (*pIVar5->_vptr_Index[5])(pIVar5);
      this_00 = this_00 + 1;
    } while (1 < (byte)((char)iVar3 - 1U));
    pthread_mutex_unlock((pthread_mutex_t *)&pDVar4->indexes);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool DataTable::HasUniqueIndexes() const {
	if (!HasIndexes()) {
		return false;
	}
	bool has_unique_index = false;
	info->indexes.Scan([&](Index &index) {
		if (index.IsUnique()) {
			has_unique_index = true;
			return true;
		}
		return false;
	});
	return has_unique_index;
}